

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caseconvert.cpp
# Opt level: O2

idx_t duckdb::GetResultLength<false>(char *input_data,idx_t input_length)

{
  int32_t iVar1;
  int iVar2;
  ulong in_RAX;
  long lVar3;
  long lVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uStack_38;
  int sz;
  
  iVar5 = 0;
  uStack_38 = in_RAX;
  for (uVar6 = 0; uVar6 < input_length; uVar6 = uVar6 + lVar3) {
    lVar3 = 1;
    lVar4 = 1;
    if (input_data[uVar6] < '\0') {
      uStack_38 = uStack_38 & 0xffffffff;
      iVar1 = Utf8Proc::UTF8ToCodepoint(input_data + uVar6,&sz);
      iVar1 = Utf8Proc::CodepointToLower(iVar1);
      iVar2 = Utf8Proc::CodepointLength(iVar1);
      lVar4 = (long)iVar2;
      lVar3 = (long)sz;
    }
    iVar5 = iVar5 + lVar4;
  }
  return iVar5;
}

Assistant:

static idx_t GetResultLength(const char *input_data, idx_t input_length) {
	idx_t output_length = 0;
	for (idx_t i = 0; i < input_length;) {
		if (input_data[i] & 0x80) {
			// unicode
			int sz = 0;
			auto codepoint = Utf8Proc::UTF8ToCodepoint(input_data + i, sz);
			auto converted_codepoint =
			    IS_UPPER ? Utf8Proc::CodepointToUpper(codepoint) : Utf8Proc::CodepointToLower(codepoint);
			auto new_sz = Utf8Proc::CodepointLength(converted_codepoint);
			D_ASSERT(new_sz >= 0);
			output_length += UnsafeNumericCast<idx_t>(new_sz);
			i += UnsafeNumericCast<idx_t>(sz);
		} else {
			// ascii
			output_length++;
			i++;
		}
	}
	return output_length;
}